

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

void drmp3_L3_antialias(float *grbuf,int nbands)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  drmp3_f4 vc1;
  drmp3_f4 vc0;
  drmp3_f4 vd;
  drmp3_f4 vu;
  int i;
  int nbands_local;
  float *grbuf_local;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  _i = grbuf;
  for (vu[3] = (float)nbands; 0 < (int)vu[3]; vu[3] = (float)((int)vu[3] + -1)) {
    vu[2] = 0.0;
    iVar5 = drmp3_have_simd();
    if (iVar5 != 0) {
      for (; (int)vu[2] < 8; vu[2] = (float)((int)vu[2] + 4)) {
        uVar1 = *(undefined8 *)(_i + (long)(int)vu[2] + 0x12);
        uVar2 = *(undefined8 *)(_i + (long)(int)vu[2] + 0x12 + 2);
        uVar3 = *(undefined8 *)(_i + (0xe - (long)(int)vu[2]));
        uVar4 = *(undefined8 *)(_i + (0xe - (long)(int)vu[2]) + 2);
        vc0[2] = (float)uVar3;
        vc0[3] = (float)((ulong)uVar3 >> 0x20);
        vd[0] = (float)uVar4;
        vd[1] = (float)((ulong)uVar4 >> 0x20);
        local_18 = (float)uVar1;
        fStack_14 = (float)((ulong)uVar1 >> 0x20);
        fStack_10 = (float)uVar2;
        fStack_c = (float)((ulong)uVar2 >> 0x20);
        local_28 = (float)*(undefined8 *)(drmp3_L3_antialias::g_aa[0] + (int)vu[2]);
        fStack_24 = (float)((ulong)*(undefined8 *)(drmp3_L3_antialias::g_aa[0] + (int)vu[2]) >> 0x20
                           );
        fStack_20 = (float)*(undefined8 *)(drmp3_L3_antialias::g_aa[0] + (long)(int)vu[2] + 2);
        fStack_1c = (float)((ulong)*(undefined8 *)
                                    (drmp3_L3_antialias::g_aa[0] + (long)(int)vu[2] + 2) >> 0x20);
        local_48 = (float)*(undefined8 *)(drmp3_L3_antialias::g_aa[1] + (int)vu[2]);
        fStack_44 = (float)((ulong)*(undefined8 *)(drmp3_L3_antialias::g_aa[1] + (int)vu[2]) >> 0x20
                           );
        fStack_40 = (float)*(undefined8 *)(drmp3_L3_antialias::g_aa[1] + (long)(int)vu[2] + 2);
        fStack_3c = (float)((ulong)*(undefined8 *)
                                    (drmp3_L3_antialias::g_aa[1] + (long)(int)vu[2] + 2) >> 0x20);
        *(ulong *)(_i + (long)(int)vu[2] + 0x12) =
             CONCAT44(fStack_14 * fStack_24 - vd[0] * fStack_44,
                      local_18 * local_28 - vd[1] * local_48);
        *(ulong *)(_i + (long)(int)vu[2] + 0x12 + 2) =
             CONCAT44(fStack_c * fStack_1c - vc0[2] * fStack_3c,
                      fStack_10 * fStack_20 - vc0[3] * fStack_40);
        *(ulong *)(_i + (0xe - (long)(int)vu[2])) =
             CONCAT44(fStack_10 * fStack_40 + vc0[3] * fStack_20,
                      fStack_c * fStack_3c + vc0[2] * fStack_1c);
        *(ulong *)(_i + (0x10 - (long)(int)vu[2])) =
             CONCAT44(local_18 * local_48 + vd[1] * local_28,
                      fStack_14 * fStack_44 + vd[0] * fStack_24);
      }
    }
    _i = _i + 0x12;
  }
  return;
}

Assistant:

static void drmp3_L3_antialias(float *grbuf, int nbands)
{
    static const float g_aa[2][8] = {
        {0.85749293f,0.88174200f,0.94962865f,0.98331459f,0.99551782f,0.99916056f,0.99989920f,0.99999316f},
        {0.51449576f,0.47173197f,0.31337745f,0.18191320f,0.09457419f,0.04096558f,0.01419856f,0.00369997f}
    };

    for (; nbands > 0; nbands--, grbuf += 18)
    {
        int i = 0;
#if DRMP3_HAVE_SIMD
        if (drmp3_have_simd()) for (; i < 8; i += 4)
        {
            drmp3_f4 vu = DRMP3_VLD(grbuf + 18 + i);
            drmp3_f4 vd = DRMP3_VLD(grbuf + 14 - i);
            drmp3_f4 vc0 = DRMP3_VLD(g_aa[0] + i);
            drmp3_f4 vc1 = DRMP3_VLD(g_aa[1] + i);
            vd = DRMP3_VREV(vd);
            DRMP3_VSTORE(grbuf + 18 + i, DRMP3_VSUB(DRMP3_VMUL(vu, vc0), DRMP3_VMUL(vd, vc1)));
            vd = DRMP3_VADD(DRMP3_VMUL(vu, vc1), DRMP3_VMUL(vd, vc0));
            DRMP3_VSTORE(grbuf + 14 - i, DRMP3_VREV(vd));
        }
#endif
#ifndef DR_MP3_ONLY_SIMD
        for(; i < 8; i++)
        {
            float u = grbuf[18 + i];
            float d = grbuf[17 - i];
            grbuf[18 + i] = u*g_aa[0][i] - d*g_aa[1][i];
            grbuf[17 - i] = u*g_aa[1][i] + d*g_aa[0][i];
        }
#endif
    }
}